

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_helper.cpp
# Opt level: O3

void __thiscall
license::CryptoHelper::loadPrivateKey_file(CryptoHelper *this,string *privateKey_file_name)

{
  pointer pcVar1;
  logic_error *this_00;
  long *plVar2;
  long *plVar3;
  string pk_string;
  ifstream private_key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  long *local_230;
  long local_228;
  long local_220;
  long lStack_218;
  undefined8 auStack_148 [36];
  
  pcVar1 = (privateKey_file_name->_M_dataplus)._M_p;
  local_230 = &local_220;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_230,pcVar1,pcVar1 + privateKey_file_name->_M_string_length);
  boost::filesystem::detail::status((detail *)&local_250,(path *)&local_230,(error_code *)0x0);
  if (local_230 != &local_220) {
    operator_delete(local_230);
  }
  if (1 < (uint)local_250._M_dataplus._M_p) {
    std::ifstream::ifstream(&local_230,(string *)privateKey_file_name,_S_in);
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
              ((string *)&local_250,*(undefined8 *)((long)auStack_148 + local_230[-3]),0xffffffff,0,
               0xffffffff);
    (*this->_vptr_CryptoHelper[4])(this,&local_250);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p);
    }
    std::ifstream::~ifstream(&local_230);
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_250,"Private key file [",privateKey_file_name);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_250);
  local_230 = (long *)*plVar2;
  plVar3 = plVar2 + 2;
  if (local_230 == plVar3) {
    local_220 = *plVar3;
    lStack_218 = plVar2[3];
    local_230 = &local_220;
  }
  else {
    local_220 = *plVar3;
  }
  local_228 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::logic_error::logic_error(this_00,(string *)&local_230);
  __cxa_throw(this_00,std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void CryptoHelper::loadPrivateKey_file(const std::string &privateKey_file_name) {
	if (!fs::exists(privateKey_file_name)) {
		throw logic_error("Private key file [" + privateKey_file_name + "] does not exists");
	}
	std::ifstream private_key(privateKey_file_name);
	std::string pk_string((std::istreambuf_iterator<char>(private_key)), std::istreambuf_iterator<char>());
	loadPrivateKey(pk_string);
}